

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O2

ByteData *
cfd::core::WallyUtil::AddTweakPubkey
          (ByteData *__return_storage_ptr__,ByteData *pubkey,ByteData256 *tweak,bool is_tweak_check)

{
  secp256k1_context_struct *context;
  Secp256k1 secp256k1;
  Secp256k1 local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  context = wally_get_secp_context();
  Secp256k1::Secp256k1(&local_60,context);
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,tweak);
  ByteData::ByteData((ByteData *)&local_58,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  Secp256k1::AddTweakPubkeySecp256k1Ec
            (__return_storage_ptr__,&local_60,pubkey,(ByteData *)&local_58,is_tweak_check);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  return __return_storage_ptr__;
}

Assistant:

ByteData WallyUtil::AddTweakPubkey(
    const ByteData& pubkey, const ByteData256& tweak, bool is_tweak_check) {
  struct secp256k1_context_struct* context = wally_get_secp_context();
  Secp256k1 secp256k1(context);
  return secp256k1.AddTweakPubkeySecp256k1Ec(
      pubkey, ByteData(tweak.GetBytes()), is_tweak_check);
}